

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kfpu.c
# Opt level: O2

void store_pack_float80(uint32 ea,int k,floatx80 fpr)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  uint uVar4;
  float64 fVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  uint value;
  int iVar9;
  char *pcVar10;
  byte bVar11;
  byte bVar12;
  char *pcVar13;
  byte *pbVar14;
  byte *pbVar15;
  uint value_00;
  long lVar16;
  bool bVar17;
  floatx80 a;
  char str [128];
  
  a._4_4_ = 0;
  a._0_4_ = fpr._0_4_;
  a.low = fpr.low;
  fVar5 = floatx80_to_float64(a);
  sprintf(str,"%.16e",fVar5);
  bVar17 = str[0] == '-';
  uVar8 = (ulong)bVar17;
  pbVar15 = (byte *)(str + 1);
  if (bVar17) {
    pbVar15 = (byte *)(str + 2);
  }
  cVar1 = str[uVar8];
  pbVar6 = (byte *)(str + 3);
  if (!bVar17) {
    pbVar6 = (byte *)(str + 2);
  }
  uVar3 = uVar8;
  if (cVar1 == '+') {
    pbVar15 = (byte *)(str + uVar8 + 2);
    uVar3 = uVar8 + 1;
  }
  if (cVar1 == '+') {
    pbVar6 = (byte *)(str + uVar8 + 3);
  }
  cVar2 = str[uVar3];
  bVar12 = *pbVar15;
  if (bVar12 != 0x2e) {
    pbVar6 = pbVar15;
  }
  if (k + 0xdU < 0xe) {
    pcVar10 = str + 0x14;
    if (str[0] != '-') {
      pcVar10 = str + 0x13;
    }
    pcVar13 = str + (ulong)(str[0] == '-') + 0x14;
    if (cVar1 == '+') {
      pcVar10 = pcVar13;
      pcVar13 = str + uVar8 + 0x15;
    }
    if (bVar12 == 0x2e) {
      pcVar10 = pcVar13;
    }
    uVar7 = 0;
    for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
      if ((byte)(pcVar10[lVar16] - 0x30U) < 10) {
        uVar7 = uVar7 << 4 | (int)(char)(pcVar10[lVar16] - 0x30U);
      }
    }
    uVar8 = (ulong)(str[0] == '-');
    pcVar10 = str + 0x12;
    if (str[0] == '-') {
      pcVar10 = str + 0x13;
    }
    lVar16 = uVar8 + 0x13;
    if (cVar1 == '+') {
      lVar16 = uVar8 + 0x14;
    }
    pcVar13 = str + uVar8 + 0x13;
    if (cVar1 != '+') {
      pcVar13 = pcVar10;
    }
    pcVar10 = str + lVar16;
    if (bVar12 != 0x2e) {
      pcVar10 = pcVar13;
    }
    uVar4 = -uVar7;
    if (*pcVar10 != '-') {
      uVar4 = uVar7;
    }
    lVar16 = (long)(int)(uVar4 - k);
    if ('4' < (char)pbVar6[lVar16]) {
      pbVar6[(int)(uVar4 + ~k)] = pbVar6[(int)(uVar4 + ~k)] + 1;
    }
    for (; lVar16 < 0x10; lVar16 = lVar16 + 1) {
      pbVar6[lVar16] = 0x30;
    }
    k = 0;
  }
  uVar7 = (int)cVar2 - 0x30U | (uint)bVar17 << 0x1f;
  iVar9 = 8;
  value = 0;
  while (bVar17 = iVar9 != 0, iVar9 = iVar9 + -1, bVar17) {
    bVar11 = *pbVar6 - 0x30;
    bVar12 = bVar11;
    if (bVar11 >= 10) {
      bVar12 = 0;
    }
    pbVar6 = pbVar6 + (bVar11 < 10);
    value = value << 4 | (int)(char)bVar12;
  }
  iVar9 = 8;
  value_00 = 0;
  while (bVar17 = iVar9 != 0, iVar9 = iVar9 + -1, bVar17) {
    bVar11 = *pbVar6 - 0x30;
    bVar12 = bVar11;
    if (bVar11 >= 10) {
      bVar12 = 0;
    }
    pbVar6 = pbVar6 + (bVar11 < 10);
    value_00 = value_00 << 4 | (int)(char)bVar12;
  }
  if (k - 1U < 0x11) {
    value = value & pkmask2[(uint)k];
    value_00 = value_00 & pkmask3[(uint)k];
  }
  if ((*pbVar6 | 0x20) == 0x65) {
    bVar12 = pbVar6[1];
    pbVar15 = pbVar6 + 2;
    pbVar14 = pbVar6 + 3;
    if (bVar12 != 0x2d) {
      pbVar14 = pbVar15;
      pbVar15 = pbVar6 + 1;
    }
    if (pbVar6[(ulong)(bVar12 == 0x2d) + 1] != 0x2b) {
      pbVar14 = pbVar15;
    }
    iVar9 = 3;
    uVar4 = 0;
    while (bVar17 = iVar9 != 0, iVar9 = iVar9 + -1, bVar17) {
      bVar11 = *pbVar14 - 0x30;
      pbVar14 = pbVar14 + (bVar11 < 10);
      if (bVar11 < 10) {
        uVar4 = uVar4 << 4 | (int)(char)bVar11;
      }
    }
    if (bVar12 == 0x2d) {
      uVar7 = uVar7 | 0x40000000;
    }
    uVar7 = uVar7 | uVar4 << 0x10;
  }
  m68ki_write_32_fc(ea,m68ki_cpu.s_flag | 1,uVar7);
  m68ki_write_32_fc(ea + 4,m68ki_cpu.s_flag | 1,value);
  m68ki_write_32_fc(ea + 8,m68ki_cpu.s_flag | 1,value_00);
  return;
}

Assistant:

static inline void store_pack_float80(uint32 ea, int k, floatx80 fpr)
{
	uint32 dw1, dw2, dw3;
	char str[128], *ch;
	int i, j, exp;

	dw1 = dw2 = dw3 = 0;
	ch = &str[0];

	sprintf(str, "%.16e", fx80_to_double(fpr));

	if (*ch == '-')
	{
		ch++;
		dw1 = 0x80000000;
	}

	if (*ch == '+')
	{
		ch++;
	}

	dw1 |= (*ch++ - '0');

	if (*ch == '.')
	{
		ch++;
	}

	// handle negative k-factor here
	if ((k <= 0) && (k >= -13))
	{
		exp = 0;
		for (i = 0; i < 3; i++)
		{
			if (ch[18+i] >= '0' && ch[18+i] <= '9')
			{
				exp = (exp << 4) | (ch[18+i] - '0');
			}
		}

		if (ch[17] == '-')
		{
			exp = -exp;
		}

		k = -k;
		// last digit is (k + exponent - 1)
		k += (exp - 1);

		// round up the last significant mantissa digit
		if (ch[k+1] >= '5')
		{
			ch[k]++;
		}

		// zero out the rest of the mantissa digits
		for (j = (k+1); j < 16; j++)
		{
			ch[j] = '0';
		}

		// now zero out K to avoid tripping the positive K detection below
		k = 0;
	}

	// crack 8 digits of the mantissa
	for (i = 0; i < 8; i++)
	{
		dw2 <<= 4;
		if (*ch >= '0' && *ch <= '9')
		{
			dw2 |= *ch++ - '0';
		}
	}

	// next 8 digits of the mantissa
	for (i = 0; i < 8; i++)
	{
		dw3 <<= 4;
		if (*ch >= '0' && *ch <= '9')
		dw3 |= *ch++ - '0';
	}

	// handle masking if k is positive
	if (k >= 1)
	{
		if (k <= 17)
		{
			dw2 &= pkmask2[k];
			dw3 &= pkmask3[k];
		}
		else
		{
			dw2 &= pkmask2[17];
			dw3 &= pkmask3[17];
//			m68ki_cpu.fpcr |=  (need to set OPERR bit)
		}
	}

	// finally, crack the exponent
	if (*ch == 'e' || *ch == 'E')
	{
		ch++;
		if (*ch == '-')
		{
			ch++;
			dw1 |= 0x40000000;
		}

		if (*ch == '+')
		{
			ch++;
		}

		j = 0;
		for (i = 0; i < 3; i++)
		{
			if (*ch >= '0' && *ch <= '9')
			{
				j = (j << 4) | (*ch++ - '0');
			}
		}

		dw1 |= (j << 16);
	}

	m68ki_write_32(ea, dw1);
	m68ki_write_32(ea+4, dw2);
	m68ki_write_32(ea+8, dw3);
}